

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::removeVertex(Graph *this,int idx)

{
  pointer ppNVar1;
  Node *pNVar2;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> __position;
  iterator __position_00;
  ostream *poVar3;
  Node **node;
  pointer ppNVar4;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  Node *local_38;
  
  ppNVar4 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar1 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = getNode(this,idx);
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_equals_val<Node*const>>
                         (ppNVar4,ppNVar1,&local_38);
  ppNVar1 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar4 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar4 != ppNVar1; ppNVar4 = ppNVar4 + 1) {
    pNVar2 = *ppNVar4;
    local_38 = getNode(this,idx);
    __position_00 =
         std::
         _Rb_tree<Node_*,_std::pair<Node_*const,_int>,_std::_Select1st<std::pair<Node_*const,_int>_>,_std::less<Node_*>,_std::allocator<std::pair<Node_*const,_int>_>_>
         ::find(&(pNVar2->edges)._M_t,&local_38);
    if ((_Rb_tree_header *)__position_00._M_node !=
        &((*ppNVar4)->edges)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
      ::erase_abi_cxx11_((_Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
                          *)&(*ppNVar4)->edges,__position_00);
    }
  }
  std::vector<Node_*,_std::allocator<Node_*>_>::erase
            (&this->adj_list,(const_iterator)__position._M_current);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Removed Vertex ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,idx);
  std::operator<<(poVar3,'\n');
  return;
}

Assistant:

void Graph::removeVertex(int idx) {
    auto it = std::find(adj_list.begin(), adj_list.end(), getNode(idx));

    for(auto&node:adj_list){
        auto iter = node->edges.find(getNode(idx));
        if(iter!=node->edges.end())
            node->edges.erase(iter);
    }

    adj_list.erase(it);

    std::cerr<< "Removed Vertex " << idx<<'\n';
}